

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPortDataTransfer.cpp
# Opt level: O0

int __thiscall CPortDataTransfer::DispatchCommand(CPortDataTransfer *this,int client_fd)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  ulong uVar5;
  void *__buf;
  long lVar6;
  ssize_t sVar7;
  undefined8 uVar8;
  ostream *poVar9;
  char *pcVar10;
  FILE *pFVar11;
  size_t sVar12;
  unsigned_long uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  allocator local_2171;
  undefined1 local_2170 [8];
  string ret_2;
  double speed_1;
  long lStack_2140;
  uint sum_1;
  unsigned_long sum_sec_1;
  time_t pre_time_1;
  time_t current_time_1;
  char buffer_1 [4096];
  ssize_t n_1;
  FILE *file_1;
  undefined1 local_1108 [8];
  string ret_1;
  double progress;
  double speed;
  unsigned_long sum;
  unsigned_long sum_sec;
  time_t pre_time;
  time_t current_time;
  char buffer [4096];
  int n;
  long size;
  FILE *file;
  undefined1 local_90 [8];
  string ret;
  allocator local_59;
  string local_58;
  undefined1 local_38 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  int client_fd_local;
  CPortDataTransfer *this_local;
  
  v.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = client_fd;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"#",&local_59);
  SplitString(&this->m_Msg,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,0);
  bVar2 = std::operator==(pvVar4,"SENDLIST");
  if (!bVar2) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_38,0);
    bVar2 = std::operator==(pvVar4,"SENDFILE");
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,1);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      chdir(pcVar10);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38,2);
      pcVar10 = (char *)std::__cxx11::string::c_str();
      pFVar11 = fopen(pcVar10,"rb");
      fseek(pFVar11,0,2);
      lVar6 = ftell(pFVar11);
      fseek(pFVar11,0,0);
      bzero(&current_time,0x1000);
      sum_sec = time((time_t *)0x0);
      sum = 0;
      speed = 0.0;
      while( true ) {
        sVar12 = fread(&current_time,1,0x1000,pFVar11);
        iVar3 = (int)sVar12;
        if ((iVar3 < 1) ||
           (sVar7 = send(v.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,&current_time,
                         (long)iVar3,0), sVar7 < 1)) break;
        sum = (long)iVar3 + sum;
        speed = (double)((long)iVar3 + (long)speed);
        uVar13 = time((time_t *)0x0);
        if (0 < (long)(uVar13 - sum_sec)) {
          auVar14._8_4_ = (int)(sum >> 0x20);
          auVar14._0_8_ = sum;
          auVar14._12_4_ = 0x45300000;
          auVar15._8_4_ = (int)((ulong)speed >> 0x20);
          auVar15._0_8_ = speed;
          auVar15._12_4_ = 0x45300000;
          ret_1.field_2._8_8_ =
               (((auVar15._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,SUB84(speed,0)) - 4503599627370496.0)) / (double)lVar6)
               * 100.0;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_38,2);
          uVar8 = std::__cxx11::string::c_str();
          printf("%s ,progress: %.1f%% ,speed is: %.1f KB/s\n",ret_1.field_2._8_8_,
                 ((auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)sum) - 4503599627370496.0)) * 0.0009765625,uVar8)
          ;
          sum = 0;
          sum_sec = uVar13;
        }
        bzero(&current_time,0x1000);
      }
      fclose(pFVar11);
      poVar9 = std::operator<<((ostream *)&std::cout,"Send file completed.");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_1108,"226 Transfer complete.\r\n",(allocator *)((long)&file_1 + 7))
      ;
      std::allocator<char>::~allocator((allocator<char> *)((long)&file_1 + 7));
      ControlSockSendMsg(this,(string *)local_1108);
      this_local._4_4_ = 1;
      file_1._0_4_ = 1;
      std::__cxx11::string::~string((string *)local_1108);
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_38,0);
      bVar2 = std::operator==(pvVar4,"RECVFILE");
      if (bVar2) {
        poVar9 = std::operator<<((ostream *)&std::cout,"Get file ");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,1);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        poVar9 = std::operator<<(poVar9,pcVar10);
        poVar9 = std::operator<<(poVar9,"  ");
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,2);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        poVar9 = std::operator<<(poVar9,pcVar10);
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,1);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        chdir(pcVar10);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_38,2);
        pcVar10 = (char *)std::__cxx11::string::c_str();
        pFVar11 = fopen(pcVar10,"wb");
        bzero(&current_time_1,0x1000);
        sum_sec_1 = time((time_t *)0x0);
        lStack_2140 = 0;
        while (sVar12 = recv(v.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             &current_time_1,0x1000,0), 0 < (long)sVar12) {
          fwrite(&current_time_1,1,sVar12,pFVar11);
          lStack_2140 = sVar12 + lStack_2140;
          uVar13 = time((time_t *)0x0);
          if (0 < (long)(uVar13 - sum_sec_1)) {
            auVar16._8_4_ = (int)((ulong)lStack_2140 >> 0x20);
            auVar16._0_8_ = lStack_2140;
            auVar16._12_4_ = 0x45300000;
            ret_2.field_2._8_8_ =
                 ((auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lStack_2140) - 4503599627370496.0)) *
                 0.0009765625;
            printf("speed is: %.1f KB/s\n",ret_2.field_2._8_8_);
            lStack_2140 = 0;
            sum_sec_1 = uVar13;
          }
          bzero(&current_time_1,0x1000);
        }
        fclose(pFVar11);
        poVar9 = std::operator<<((ostream *)&std::cout,"Recv file completed.");
        std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_2170,"226 Transfer complete.\r\n",&local_2171);
        std::allocator<char>::~allocator((allocator<char> *)&local_2171);
        ControlSockSendMsg(this,(string *)local_2170);
        this_local._4_4_ = 1;
        file_1._0_4_ = 1;
        std::__cxx11::string::~string((string *)local_2170);
      }
      else {
        this_local._4_4_ = 0;
        file_1._0_4_ = 1;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_38);
    return this_local._4_4_;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_38,1);
  uVar5 = std::__cxx11::string::empty();
  iVar3 = v.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  if ((uVar5 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38,1);
    __buf = (void *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_38,1);
    sVar12 = std::__cxx11::string::size();
    send(iVar3,__buf,sVar12,0);
  }
  else {
    send(v.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,"\r\n",2,0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,"226 Directory send OK.\r\n",(allocator *)((long)&file + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&file + 7));
  ControlSockSendMsg(this,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int CPortDataTransfer::DispatchCommand(int client_fd) {
    vector<string> v;
    SplitString(m_Msg,v,"#");
    if(v[0] == "SENDLIST"){
        if(!v[1].empty()){
            send(client_fd,v[1].c_str(),v[1].size(),0);
        }
        else{
            send(client_fd,"\r\n",2,0);
        }
        string ret = "226 Directory send OK.\r\n";
        ControlSockSendMsg(ret);
    }
    else if(v[0] == "SENDFILE"){
        //cout << "Get file " << v[1].c_str() << "  " <<  v[2].c_str() << endl;

        chdir(v[1].c_str());
        FILE *file = fopen(v[2].c_str(),"rb");
        fseek(file,0,2);
        long size = ftell(file);
        fseek(file,0,0);
        int n = 0;
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        time_t current_time,pre_time;
        pre_time= time(NULL);
        unsigned long sum_sec = 0;
        unsigned long sum = 0;
        while((n = fread(buffer,1,BUFFER_SIZE,file)) > 0){
            if(send(client_fd,buffer,n,0) <= 0)
                break;
            sum_sec += n;
            sum += n;
            current_time = time(NULL);
            if(current_time - pre_time >= 1){
                pre_time = current_time;
                double speed = (sum_sec * 1.0) / 1024;
                double progress = sum * 1.0 / size * 100;
                printf("%s ,progress: %.1f%% ,speed is: %.1f KB/s\n",v[2].c_str(),progress,speed);
                sum_sec = 0;
            }
            bzero(buffer,BUFFER_SIZE);
        }
        fclose(file);
        cout << "Send file completed." << endl;
        string ret = "226 Transfer complete.\r\n";
        ControlSockSendMsg(ret);
        return 1;
    }
    else if(v[0] == "RECVFILE"){
        cout << "Get file " << v[1].c_str() << "  " <<  v[2].c_str() << endl;
        chdir(v[1].c_str());
        FILE *file = fopen(v[2].c_str(),"wb");
        ssize_t n = 0;
        char buffer[BUFFER_SIZE];
        bzero(buffer,BUFFER_SIZE);
        time_t current_time,pre_time;
        pre_time = time(NULL);
        unsigned long sum_sec = 0;
        unsigned sum = 0;
        while((n = recv(client_fd,buffer,BUFFER_SIZE,0)) > 0){
            fwrite(buffer,1,n,file);
            sum_sec += n;
            current_time = time(NULL);
            if(current_time - pre_time >= 1){
                pre_time = current_time;
                double speed = (sum_sec  * 1.0) / 1024;
                printf("speed is: %.1f KB/s\n",speed);
                sum_sec = 0;
            }
            bzero(buffer,BUFFER_SIZE);
        }
        fclose(file);
        cout << "Recv file completed." << endl;
        string ret = "226 Transfer complete.\r\n";
        ControlSockSendMsg(ret);
        return 1;
    }
    else{
        return 0;
    }
}